

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O0

void __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::ClassArray
          (ClassArray<soplex::Nonzero<double>_> *this,int p_size,int p_max,double p_fac)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  ClassArray<soplex::Nonzero<double>_> *in_RDI;
  double in_XMM0_Qa;
  Nonzero<double> **unaff_retaddr;
  int i;
  int local_30;
  int local_2c;
  int local_1c;
  ClassArray<soplex::Nonzero<double>_> *pCVar2;
  
  in_RDI->_vptr_ClassArray = (_func_int **)&PTR__ClassArray_00896d08;
  in_RDI->data = (Nonzero<double> *)0x0;
  in_RDI->memFactor = in_XMM0_Qa;
  local_2c = in_ESI;
  if (in_ESI < 0) {
    local_2c = 0;
  }
  in_RDI->thesize = local_2c;
  if (in_RDI->thesize < in_EDX) {
    in_RDI->themax = in_EDX;
  }
  else {
    if (in_RDI->thesize == 0) {
      local_30 = 1;
    }
    else {
      local_30 = in_RDI->thesize;
    }
    in_RDI->themax = local_30;
  }
  pCVar2 = in_RDI;
  max(in_RDI);
  spx_alloc<soplex::Nonzero<double>*>(unaff_retaddr,(int)((ulong)pCVar2 >> 0x20));
  for (local_1c = 0; iVar1 = max(in_RDI), local_1c < iVar1; local_1c = local_1c + 1) {
    Nonzero<double>::Nonzero(in_RDI->data + local_1c);
  }
  return;
}

Assistant:

explicit ClassArray(int p_size = 0, int p_max = 0, double p_fac = 1.2)
      : data(nullptr)
      , memFactor(p_fac)
   {
      thesize = (p_size < 0) ? 0 : p_size;

      if(p_max > thesize)
         themax = p_max;
      else
         themax = (thesize == 0) ? 1 : thesize;

      spx_alloc(data, max());

      /* call default constructor for each element */
      for(int i = 0; i < max(); i++)
         new(&(data[i])) T();

      assert(isConsistent());
   }